

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots.h
# Opt level: O1

void __thiscall bandit::reporter::dots::it_skip(dots *this,string *desc)

{
  int *piVar1;
  ostream *poVar2;
  char local_58;
  undefined7 uStack_57;
  long local_50;
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28 [2];
  
  piVar1 = &(this->super_colored_base).super_progress_base.specs_skipped_;
  *piVar1 = *piVar1 + 1;
  poVar2 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[3])(&local_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_38,local_30);
  local_58 = 'S';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_58,1);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_58);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(char *)CONCAT71(uStack_57,local_58),local_50);
  if ((long *)CONCAT71(uStack_57,local_58) != local_48) {
    operator_delete((long *)CONCAT71(uStack_57,local_58),local_48[0] + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void it_skip(const std::string& desc) override {
        progress_base::it_skip(desc);
        stm_ << colorizer_.neutral() << 'S' << colorizer_.reset();
        stm_.flush();
      }